

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O2

Solution * __thiscall SolutionNeighbourhood::getNext(SolutionNeighbourhood *this)

{
  Turn *pTVar1;
  NurseSolution *pNVar2;
  NurseSolution *this_00;
  pointer pvVar3;
  bool bVar4;
  pointer ppNVar5;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar6;
  Move *pMVar7;
  ShiftType *pSVar8;
  string *psVar9;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar10;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *pvVar11;
  Scenario *this_01;
  WeekData *this_02;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_03;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_04;
  mapped_type *this_05;
  const_reference ppDVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar13;
  _Base_ptr p_Var14;
  Solution *pSVar15;
  pointer ppNVar16;
  int iVar17;
  Solution *unaff_RBP;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  allocator local_135;
  int local_134;
  Move *local_130;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> tempVector;
  string local_110;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  undoLastMove(this);
  if (this->phase == 0) {
    do {
      do {
        pvVar10 = Solution::getTurns(this->solution);
        pTVar1 = *(Turn **)(*(long *)&(pvVar10->
                                      super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[this->iterator1].
                                      super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                                      super__Vector_impl_data + (long)this->iterator2 * 8);
        pvVar11 = Turn::getNurses(pTVar1);
        ppNVar5 = (pvVar11->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        ppNVar16 = (pvVar11->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        this_01 = Scenario::getInstance();
        this_02 = Scenario::getWeekData(this_01);
        this_03 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)WeekData::getRequirements_abi_cxx11_(this_02);
        psVar9 = Turn::getSkill_abi_cxx11_(pTVar1);
        this_04 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at(this_03,psVar9);
        pSVar8 = Turn::getShiftType(pTVar1);
        psVar9 = ShiftType::getId_abi_cxx11_(pSVar8);
        this_05 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at(this_04,psVar9);
        iVar17 = Turn::getDay(pTVar1);
        ppDVar12 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                             (this_05,(long)iVar17);
        iVar17 = DayRequirement::getOptimalCoverage(*ppDVar12);
        if ((ulong)((long)ppNVar5 - (long)ppNVar16 >> 3) < (ulong)(long)iVar17) {
          tempVector.super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tempVector.super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          tempVector.super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pmVar13 = Solution::getNurses_abi_cxx11_(this->solution);
          for (p_Var14 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              pmVar13 = Solution::getNurses_abi_cxx11_(this->solution),
              (_Rb_tree_header *)p_Var14 != &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
            std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::push_back
                      ((vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *)
                       &tempVector.
                        super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>,
                       (value_type *)(p_Var14 + 2));
          }
          iVar17 = this->iteratorTurn1;
          while( true ) {
            uVar19 = (ulong)iVar17;
            uVar21 = (long)tempVector.
                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)tempVector.
                           super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            if (uVar21 <= uVar19) break;
            bVar4 = Solution::assignNurseToTurn
                              (this->solution,
                               tempVector.
                               super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar19],pTVar1);
            if (bVar4) {
              local_130 = (Move *)operator_new(0x70);
              std::__cxx11::string::string((string *)&local_110,"",&local_135);
              Position::Position((Position *)local_60,-1,(ShiftType *)0x0,&local_110);
              local_134 = Turn::getDay(pTVar1);
              pSVar8 = Turn::getShiftType(pTVar1);
              psVar9 = Turn::getSkill_abi_cxx11_(pTVar1);
              Position::Position((Position *)local_90,local_134,pSVar8,psVar9);
              pMVar7 = local_130;
              Move::Move(local_130,(Position *)local_60,(Position *)local_90,
                         tempVector.
                         super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[this->iteratorTurn1]);
              this->lastMove = pMVar7;
              std::__cxx11::string::~string((string *)(local_90 + 0x10));
              std::__cxx11::string::~string((string *)(local_60 + 0x10));
              std::__cxx11::string::~string((string *)&local_110);
              this->iteratorTurn1 = this->iteratorTurn1 + 1;
              unaff_RBP = this->solution;
              break;
            }
            iVar17 = this->iteratorTurn1 + 1;
            this->iteratorTurn1 = iVar17;
          }
          std::_Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>::~_Vector_base
                    (&tempVector.
                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>);
          if (uVar19 < uVar21) {
            return unaff_RBP;
          }
        }
        this->iteratorTurn1 = 0;
        lVar20 = (long)this->iterator2 + 1;
        this->iterator2 = (int)lVar20;
        pvVar10 = Solution::getTurns(this->solution);
        lVar22 = (long)this->iterator1;
        pvVar3 = (pvVar10->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while ((long)*(pointer *)
                      ((long)&pvVar3[lVar22].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                              _M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar3[lVar22].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                         super__Vector_impl_data >> 3 != lVar20);
      this->iterator2 = 0;
      this->iterator1 = (int)(lVar22 + 1);
      pvVar10 = Solution::getTurns(this->solution);
    } while (((long)(pvVar10->
                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar10->
                   super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18 != lVar22 + 1);
    this->phase = this->phase + 1;
    this->iterator1 = 0;
    this->iterator2 = 0;
    pSVar15 = getNext(this);
  }
  else {
    if (this->phase == 1) {
      iVar17 = this->iterator1;
      ppNVar5 = (this->nurseVector).
                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar16 = (this->nurseVector).
                 super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      while ((ulong)(long)iVar17 < (ulong)((long)ppNVar16 - (long)ppNVar5 >> 3)) {
        iVar17 = this->iterator2;
        while ((ulong)(long)iVar17 < (ulong)((long)ppNVar16 - (long)ppNVar5 >> 3)) {
          iVar18 = this->iterator1;
          if (iVar18 != iVar17) {
            iVar17 = this->iteratorTurn1;
            while (pvVar6 = NurseSolution::getTurns(ppNVar5[iVar18]),
                  (ulong)(long)iVar17 <
                  (ulong)((long)(pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3)) {
              iVar17 = this->iteratorTurn2;
              while (pvVar6 = NurseSolution::getTurns
                                        ((this->nurseVector).
                                         super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start[this->iterator2])
                    , (ulong)(long)iVar17 <
                      (ulong)((long)(pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
                pvVar6 = NurseSolution::getTurns
                                   ((this->nurseVector).
                                    super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->iterator1]);
                pTVar1 = (pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[this->iteratorTurn1];
                pvVar6 = NurseSolution::getTurns
                                   ((this->nurseVector).
                                    super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->iterator2]);
                if (pTVar1 != (pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                              super__Vector_impl_data._M_start[this->iteratorTurn2]) {
                  ppNVar5 = (this->nurseVector).
                            super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pNVar2 = ppNVar5[this->iterator1];
                  pvVar6 = NurseSolution::getTurns(ppNVar5[this->iterator2]);
                  bVar4 = NurseSolution::hasTurn
                                    (pNVar2,(pvVar6->
                                            super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                            _M_impl.super__Vector_impl_data._M_start
                                            [this->iteratorTurn2]);
                  if (!bVar4) {
                    ppNVar5 = (this->nurseVector).
                              super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    pNVar2 = ppNVar5[this->iterator2];
                    pvVar6 = NurseSolution::getTurns(ppNVar5[this->iterator1]);
                    bVar4 = NurseSolution::hasTurn
                                      (pNVar2,(pvVar6->
                                              super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                              _M_impl.super__Vector_impl_data._M_start
                                              [this->iteratorTurn1]);
                    if (!bVar4) {
                      pMVar7 = (Move *)operator_new(0x70);
                      pvVar6 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator1]
                                         );
                      iVar17 = Turn::getDay((pvVar6->
                                            super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                            _M_impl.super__Vector_impl_data._M_start
                                            [this->iteratorTurn1]);
                      pvVar6 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator1]
                                         );
                      pSVar8 = Turn::getShiftType((pvVar6->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn1]);
                      pvVar6 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator1]
                                         );
                      psVar9 = Turn::getSkill_abi_cxx11_
                                         ((pvVar6->
                                          super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                          _M_impl.super__Vector_impl_data._M_start
                                          [this->iteratorTurn1]);
                      Position::Position((Position *)local_c0,iVar17,pSVar8,psVar9);
                      pvVar6 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator2]
                                         );
                      iVar17 = Turn::getDay((pvVar6->
                                            super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                            _M_impl.super__Vector_impl_data._M_start
                                            [this->iteratorTurn2]);
                      pvVar6 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator2]
                                         );
                      pSVar8 = Turn::getShiftType((pvVar6->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->iteratorTurn2]);
                      pvVar6 = NurseSolution::getTurns
                                         ((this->nurseVector).
                                          super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[this->iterator2]
                                         );
                      psVar9 = Turn::getSkill_abi_cxx11_
                                         ((pvVar6->
                                          super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                          _M_impl.super__Vector_impl_data._M_start
                                          [this->iteratorTurn2]);
                      Position::Position((Position *)local_f0,iVar17,pSVar8,psVar9);
                      ppNVar5 = (this->nurseVector).
                                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      Move::Move(pMVar7,(Position *)local_c0,(Position *)local_f0,
                                 ppNVar5[this->iterator1],ppNVar5[this->iterator2]);
                      this->lastMove = pMVar7;
                      std::__cxx11::string::~string((string *)(local_f0 + 0x10));
                      std::__cxx11::string::~string((string *)(local_c0 + 0x10));
                      pSVar15 = this->solution;
                      pNVar2 = (this->nurseVector).
                               super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->iterator1];
                      pvVar6 = NurseSolution::getTurns(pNVar2);
                      pTVar1 = (pvVar6->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl
                               .super__Vector_impl_data._M_start[this->iteratorTurn1];
                      this_00 = (this->nurseVector).
                                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->iterator2];
                      pvVar6 = NurseSolution::getTurns(this_00);
                      bVar4 = Solution::atomicSwitchNurseTurns
                                        (pSVar15,pNVar2,pTVar1,this_00,
                                         (pvVar6->
                                         super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                         _M_impl.super__Vector_impl_data._M_start
                                         [this->iteratorTurn2]);
                      if (bVar4) {
                        this->iteratorTurn2 = this->iteratorTurn2 + 1;
                        goto LAB_00113061;
                      }
                      pMVar7 = this->lastMove;
                      if (pMVar7 != (Move *)0x0) {
                        Move::~Move(pMVar7);
                      }
                      operator_delete(pMVar7,0x70);
                      this->lastMove = (Move *)0x0;
                    }
                  }
                }
                iVar17 = this->iteratorTurn2 + 1;
                this->iteratorTurn2 = iVar17;
              }
              iVar17 = this->iteratorTurn1 + 1;
              this->iteratorTurn1 = iVar17;
              this->iteratorTurn2 = 0;
              iVar18 = this->iterator1;
              ppNVar5 = (this->nurseVector).
                        super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
            iVar17 = this->iterator2;
            ppNVar5 = (this->nurseVector).
                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppNVar16 = (this->nurseVector).
                       super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
                       .super__Vector_impl_data._M_finish;
          }
          iVar17 = iVar17 + 1;
          this->iterator2 = iVar17;
          this->iteratorTurn1 = 0;
        }
        this->iterator2 = 0;
        iVar17 = this->iterator1 + 1;
        this->iterator1 = iVar17;
      }
    }
    this->ended = true;
LAB_00113061:
    pSVar15 = this->solution;
  }
  return pSVar15;
}

Assistant:

Solution *SolutionNeighbourhood::getNext(){
    undoLastMove();
    if(phase == 0) {
        while (1) {
            Turn *currentTurn = solution->getTurns()[iterator1][iterator2];

            if (currentTurn->getNurses().size() <
                Scenario::getInstance()->getWeekData().getRequirements().at(currentTurn->getSkill()).at(
                        currentTurn->getShiftType()->getId()).at(currentTurn->getDay())->getOptimalCoverage()) {
                vector<NurseSolution *> tempVector;
                for (auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it) {
                    tempVector.push_back(it->second);
                }
                for (; iteratorTurn1 < tempVector.size();) {
                    if (solution->assignNurseToTurn(tempVector[iteratorTurn1], currentTurn)) {
                        lastMove = new Move(Position(-1, nullptr, ""),
                                            Position(currentTurn->getDay(), currentTurn->getShiftType(),
                                                     currentTurn->getSkill()), tempVector[iteratorTurn1]);
                        iteratorTurn1++;
                        return solution;
                    }
                    else iteratorTurn1++;
                }
            }
            iteratorTurn1 = 0;
            iterator2++;
            if (iterator2 == solution->getTurns()[iterator1].size()) {
                iterator2 = 0;
                iterator1++;
                if (iterator1 == solution->getTurns().size()) {
                    phase++;
                    iterator1 = 0;
                    iterator2 = 0;
                    return this->getNext();
                }
            }

        }
    }
    //iterate each nurse then iterate the otherNurses and check if they can trade Turns
    else if(phase == 1){
        for(;iterator1 < this->nurseVector.size();){
            for(;iterator2 < this->nurseVector.size();)
            {
                if(iterator1 != iterator2)
                    for(;iteratorTurn1 < nurseVector[iterator1]->getTurns().size();)
                    {
                        for(;iteratorTurn2 < nurseVector[iterator2]->getTurns().size();){
                            if(nurseVector[iterator1]->getTurns()[iteratorTurn1] != nurseVector[iterator2]->getTurns()[iteratorTurn2]
                                    && !nurseVector[iterator1]->hasTurn(nurseVector[iterator2]->getTurns()[iteratorTurn2]) && !nurseVector[iterator2]->hasTurn(nurseVector[iterator1]->getTurns()[iteratorTurn1])) {
                                lastMove = new Move(
                                        //initial Position
                                        Position(nurseVector[iterator1]->getTurns()[iteratorTurn1]->getDay(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getShiftType(),
                                                 nurseVector[iterator1]->getTurns()[iteratorTurn1]->getSkill()),
                                        //lastPosition Position
                                        Position(nurseVector[iterator2]->getTurns()[iteratorTurn2]->getDay(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getShiftType(),
                                                 nurseVector[iterator2]->getTurns()[iteratorTurn2]->getSkill()),
                                        //Ns1 / Ns2
                                        nurseVector[iterator1], nurseVector[iterator2]);

                                if(solution->atomicSwitchNurseTurns(nurseVector[iterator1],nurseVector[iterator1]->getTurns()[iteratorTurn1],nurseVector[iterator2],nurseVector[iterator2]->getTurns()[iteratorTurn2]))
                                {
                                    iteratorTurn2++;
                                    return solution;
                                    }
                                else {
                                    delete lastMove;
                                    lastMove = nullptr;
                                    iteratorTurn2++;
                                }
                            }
                            else iteratorTurn2++;
                        }
                        iteratorTurn1++;
                        iteratorTurn2 = 0;
                    }
                iterator2++;
                iteratorTurn1 = 0;
            }
            iterator2 = 0;
            iterator1++;
        }
    }
    this->ended = true;
    return solution;
}